

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::GradientShader::shadeFragments
          (GradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float fragNdx_00;
  float packetNdx_00;
  Vector<float,_4> local_60;
  float local_50;
  float local_4c;
  float f1;
  float f0;
  float y;
  float x;
  Vec4 coord;
  int fragNdx;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  GradientShader *this_local;
  
  for (coord.m_data[3] = 0.0; (int)coord.m_data[3] < numPackets;
      coord.m_data[3] = (float)((int)coord.m_data[3] + 1)) {
    for (coord.m_data[2] = 0.0; (int)coord.m_data[2] < 4;
        coord.m_data[2] = (float)((int)coord.m_data[2] + 1)) {
      rr::readTriangleVarying<float>
                ((rr *)&y,packets + (int)coord.m_data[3],context,0,(int)coord.m_data[2]);
      f0 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&y);
      f1 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&y);
      packetNdx_00 = coord.m_data[3];
      fragNdx_00 = coord.m_data[2];
      local_4c = (f0 + f1) * 0.5;
      local_50 = (f0 - f1) * 0.5 + 0.5;
      tcu::Vector<float,_4>::Vector(&local_60,local_4c,local_50,1.0 - local_4c,1.0 - local_50);
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                (context,(int)packetNdx_00,(int)fragNdx_00,0,&local_60);
    }
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			const float			x		= coord.x();
			const float			y		= coord.y();
			const float			f0		= (x + y) * 0.5f;
			const float			f1		= 0.5f + (x - y) * 0.5f;

			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(f0, f1, 1.0f-f0, 1.0f-f1));
		}
	}